

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lupica.c
# Opt level: O1

StageResult stage_multiplier(Emulator *e)

{
  MultiplierType MVar1;
  int iVar2;
  _Bool _Var3;
  
  if ((e->state).pipeline.mm.s.active == true) {
    if (1 < e->verbosity) {
      printf("\x1b[36m%9s\x1b[37m[%08x]: ","multiply",(ulong)(e->state).pipeline.mm.s.iaddr);
      printf("%*s",0x1e,"");
    }
    MVar1 = (e->state).pipeline.mm.mul.type;
    iVar2 = (e->state).pipeline.mm.s.step + 1;
    (e->state).pipeline.mm.s.step = iVar2;
    if (iVar2 < stage_multiplier::mul_steps[MVar1]) {
      _Var3 = true;
      if (1 < e->verbosity) {
        printf("; processing...");
      }
    }
    else {
      if (MVar1 != MULTIPLIER_MULU) {
        stage_multiplier_cold_1();
      }
      (e->state).reg[0x13] = (e->state).pipeline.mm.mul.rn * (e->state).pipeline.mm.mul.rm;
      _Var3 = false;
      print_registers(e,1,0x13);
    }
    (e->state).pipeline.mm.s.active = _Var3;
    if (1 < e->verbosity) {
      putchar(10);
    }
  }
  return STAGE_RESULT_OK;
}

Assistant:

StageResult stage_multiplier(Emulator* e) {
  StageMM* mm = &e->state.pipeline.mm;

  if (!mm->s.active) {
    return STAGE_RESULT_OK;
  }

  if (e->verbosity > 1) {
    print_stage(mm->s, "multiply");
    printf("%*s", INSTR_COLUMNS, "");
  }

  static const int mul_steps[] = {
    2, /* MULTIPLIER_MULUW */
    2, /* MULTIPLIER_MULSW */
    2, /* MULTIPLIER_MACW */
    4, /* MULTIPLIER_MACL */
    4, /* MULTIPLIER_DMULSL */
    4, /* MULTIPLIER_DMULUL */
    4, /* MULTIPLIER_MULL */
  };

  int steps = mul_steps[mm->mul.type];
  if (++mm->s.step < steps) {
    if (e->verbosity > 1) {
      printf("; processing...");
    }
    mm->s.active = true;
  } else {
    u32* regs = &e->state.reg[0];

    switch (mm->mul.type) {
      case MULTIPLIER_MULU:
        regs[REGISTER_MACL] = mm->mul.rm * mm->mul.rn;
        print_registers(e, 1, REGISTER_MACL);
        break;

      default:
        UNREACHABLE("unexpected multiplier type: %d", mm->mul.type);
        break;
    }

    mm->s.active = false;
  }

  if (e->verbosity > 1) {
    printf("\n");
  }

  return STAGE_RESULT_OK;
}